

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

int mbedtls_ssl_dtls_record_replay_check(mbedtls_ssl_context *ssl,uint8_t *record_in_ctr)

{
  uchar *puVar1;
  int iVar2;
  uchar *original_in_ctr;
  int ret;
  uint8_t *record_in_ctr_local;
  mbedtls_ssl_context *ssl_local;
  
  puVar1 = ssl->in_ctr;
  ssl->in_ctr = record_in_ctr;
  iVar2 = mbedtls_ssl_dtls_replay_check(ssl);
  ssl->in_ctr = puVar1;
  return iVar2;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int mbedtls_ssl_dtls_record_replay_check(mbedtls_ssl_context *ssl, uint8_t *record_in_ctr)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *original_in_ctr;

    // save original in_ctr
    original_in_ctr = ssl->in_ctr;

    // use counter from record
    ssl->in_ctr = record_in_ctr;

    ret = mbedtls_ssl_dtls_replay_check((mbedtls_ssl_context const *) ssl);

    // restore the counter
    ssl->in_ctr = original_in_ctr;

    return ret;
}